

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O3

int testNumberOfNeighborsWithInvalidRange(void)

{
  uint32 uVar1;
  bool bVar2;
  TypeUnion TVar3;
  Int64Parameter *this;
  UniformWeighting *this_00;
  NearestNeighborsIndex *this_01;
  SquaredEuclideanDistance *this_02;
  SingleKdTreeIndex *this_03;
  ostream *poVar4;
  Int64Range *pIVar5;
  int iVar6;
  Result res;
  Model m1;
  undefined1 local_a8 [8];
  _Alloc_hider local_a0;
  undefined1 local_98 [24];
  pointer local_80;
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  Model local_58;
  
  CoreML::Specification::Model::Model(&local_58);
  CoreML::KNNValidatorTests::generateInterface(&local_58);
  if (local_58._oneof_case_[0] != 0x194) {
    CoreML::Specification::Model::clear_Type(&local_58);
    local_58._oneof_case_[0] = 0x194;
    TVar3.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x48);
    CoreML::Specification::KNearestNeighborsClassifier::KNearestNeighborsClassifier
              (TVar3.knearestneighborsclassifier_);
    local_58.Type_.pipelineclassifier_ = TVar3.pipelineclassifier_;
  }
  TVar3 = local_58.Type_;
  this = (local_58.Type_.knearestneighborsclassifier_)->numberofneighbors_;
  if (this == (Int64Parameter *)0x0) {
    this = (Int64Parameter *)operator_new(0x28);
    CoreML::Specification::Int64Parameter::Int64Parameter(this);
    (TVar3.knearestneighborsclassifier_)->numberofneighbors_ = this;
  }
  if (this->_oneof_case_[0] == 10) {
    ((this->AllowedValues_).range_)->minvalue_ = -1;
LAB_00149401:
    pIVar5 = (this->AllowedValues_).range_;
  }
  else {
    CoreML::Specification::Int64Parameter::clear_AllowedValues(this);
    this->_oneof_case_[0] = 10;
    pIVar5 = (Int64Range *)operator_new(0x28);
    CoreML::Specification::Int64Range::Int64Range(pIVar5);
    (this->AllowedValues_).range_ = pIVar5;
    uVar1 = this->_oneof_case_[0];
    pIVar5->minvalue_ = -1;
    if (uVar1 == 10) goto LAB_00149401;
    CoreML::Specification::Int64Parameter::clear_AllowedValues(this);
    this->_oneof_case_[0] = 10;
    pIVar5 = (Int64Range *)operator_new(0x28);
    CoreML::Specification::Int64Range::Int64Range(pIVar5);
    (this->AllowedValues_).range_ = pIVar5;
  }
  pIVar5->maxvalue_ = 10;
  this->defaultvalue_ = 5;
  if (((TVar3.supportvectorclassifier_)->rho_).total_size_ != 200) {
    CoreML::Specification::KNearestNeighborsClassifier::clear_WeightingScheme
              (TVar3.knearestneighborsclassifier_);
    ((TVar3.supportvectorclassifier_)->rho_).total_size_ = 200;
    this_00 = (UniformWeighting *)operator_new(0x18);
    CoreML::Specification::UniformWeighting::UniformWeighting(this_00);
    ((WeightingSchemeUnion *)((DefaultClassLabelUnion *)&(TVar3.pipeline_)->names_ + 1))->
    uniformweighting_ = this_00;
  }
  this_01 = (TVar3.knearestneighborsclassifier_)->nearestneighborsindex_;
  if (this_01 == (NearestNeighborsIndex *)0x0) {
    this_01 = (NearestNeighborsIndex *)operator_new(0x50);
    CoreML::Specification::NearestNeighborsIndex::NearestNeighborsIndex(this_01);
    (TVar3.knearestneighborsclassifier_)->nearestneighborsindex_ = this_01;
  }
  if (this_01->_oneof_case_[1] != 200) {
    CoreML::Specification::NearestNeighborsIndex::clear_DistanceFunction(this_01);
    this_01->_oneof_case_[1] = 200;
    this_02 = (SquaredEuclideanDistance *)operator_new(0x18);
    CoreML::Specification::SquaredEuclideanDistance::SquaredEuclideanDistance(this_02);
    (this_01->DistanceFunction_).squaredeuclideandistance_ = this_02;
  }
  if (this_01->_oneof_case_[0] == 0x6e) {
    this_03 = (SingleKdTreeIndex *)(this_01->IndexType_).linearindex_;
  }
  else {
    CoreML::Specification::NearestNeighborsIndex::clear_IndexType(this_01);
    this_01->_oneof_case_[0] = 0x6e;
    this_03 = (SingleKdTreeIndex *)operator_new(0x18);
    CoreML::Specification::SingleKdTreeIndex::SingleKdTreeIndex(this_03);
    (this_01->IndexType_).singlekdtreeindex_ = this_03;
  }
  this_03->leafsize_ = 0x1e;
  if ((TVar3.pipeline_)->_cached_size_ != 0x6e) {
    CoreML::Specification::KNearestNeighborsClassifier::clear_DefaultClassLabel
              (TVar3.knearestneighborsclassifier_);
    (TVar3.pipeline_)->_cached_size_ = 0x6e;
    ((DefaultClassLabelUnion *)&(TVar3.pipeline_)->names_)->defaultint64label_ =
         (int64)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  }
  local_a8 = (undefined1  [8])local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"Default","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&((DefaultClassLabelUnion *)
              &(TVar3.bayesianprobitregressor_)->regressioninputfeaturename_)->defaultstringlabel_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_a8);
  if (local_a8 != (undefined1  [8])local_98) {
    operator_delete((void *)local_a8,local_98._0_8_ + 1);
  }
  CoreML::validate<(MLModelType)404>((Result *)local_a8,&local_58);
  bVar2 = CoreML::Result::good((Result *)local_a8);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
               ,0x6d);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x238);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  }
  else {
    if (this->_oneof_case_[0] == 10) {
      ((this->AllowedValues_).range_)->minvalue_ = 0;
LAB_0014967d:
      pIVar5 = (this->AllowedValues_).range_;
    }
    else {
      CoreML::Specification::Int64Parameter::clear_AllowedValues(this);
      this->_oneof_case_[0] = 10;
      pIVar5 = (Int64Range *)operator_new(0x28);
      CoreML::Specification::Int64Range::Int64Range(pIVar5);
      (this->AllowedValues_).range_ = pIVar5;
      uVar1 = this->_oneof_case_[0];
      pIVar5->minvalue_ = 0;
      if (uVar1 == 10) goto LAB_0014967d;
      CoreML::Specification::Int64Parameter::clear_AllowedValues(this);
      this->_oneof_case_[0] = 10;
      pIVar5 = (Int64Range *)operator_new(0x28);
      CoreML::Specification::Int64Range::Int64Range(pIVar5);
      (this->AllowedValues_).range_ = pIVar5;
    }
    pIVar5->maxvalue_ = 10;
    this->defaultvalue_ = 5;
    CoreML::validate<(MLModelType)404>((Result *)&local_80,&local_58);
    local_a8 = (undefined1  [8])local_80;
    std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != &local_68) {
      operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
    }
    bVar2 = CoreML::Result::good((Result *)local_a8);
    if (bVar2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                 ,0x6d);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x240);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"!((res).good())",0xf);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
    }
    else {
      if (this->_oneof_case_[0] == 10) {
        ((this->AllowedValues_).range_)->minvalue_ = 10;
LAB_001497f7:
        pIVar5 = (this->AllowedValues_).range_;
      }
      else {
        CoreML::Specification::Int64Parameter::clear_AllowedValues(this);
        this->_oneof_case_[0] = 10;
        pIVar5 = (Int64Range *)operator_new(0x28);
        CoreML::Specification::Int64Range::Int64Range(pIVar5);
        (this->AllowedValues_).range_ = pIVar5;
        uVar1 = this->_oneof_case_[0];
        pIVar5->minvalue_ = 10;
        if (uVar1 == 10) goto LAB_001497f7;
        CoreML::Specification::Int64Parameter::clear_AllowedValues(this);
        this->_oneof_case_[0] = 10;
        pIVar5 = (Int64Range *)operator_new(0x28);
        CoreML::Specification::Int64Range::Int64Range(pIVar5);
        (this->AllowedValues_).range_ = pIVar5;
      }
      pIVar5->maxvalue_ = 1;
      this->defaultvalue_ = 5;
      CoreML::validate<(MLModelType)404>((Result *)&local_80,&local_58);
      local_a8 = (undefined1  [8])local_80;
      std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_p != &local_68) {
        operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
      }
      bVar2 = CoreML::Result::good((Result *)local_a8);
      if (bVar2) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                   ,0x6d);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x248);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"!((res).good())",0xf);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," was false, expected true.",0x1a)
        ;
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      }
      else {
        if (this->_oneof_case_[0] == 10) {
          ((this->AllowedValues_).range_)->minvalue_ = -10;
LAB_00149968:
          pIVar5 = (this->AllowedValues_).range_;
        }
        else {
          CoreML::Specification::Int64Parameter::clear_AllowedValues(this);
          this->_oneof_case_[0] = 10;
          pIVar5 = (Int64Range *)operator_new(0x28);
          CoreML::Specification::Int64Range::Int64Range(pIVar5);
          (this->AllowedValues_).range_ = pIVar5;
          uVar1 = this->_oneof_case_[0];
          pIVar5->minvalue_ = -10;
          if (uVar1 == 10) goto LAB_00149968;
          CoreML::Specification::Int64Parameter::clear_AllowedValues(this);
          this->_oneof_case_[0] = 10;
          pIVar5 = (Int64Range *)operator_new(0x28);
          CoreML::Specification::Int64Range::Int64Range(pIVar5);
          (this->AllowedValues_).range_ = pIVar5;
        }
        pIVar5->maxvalue_ = -5;
        this->defaultvalue_ = 5;
        CoreML::validate<(MLModelType)404>((Result *)&local_80,&local_58);
        local_a8 = (undefined1  [8])local_80;
        std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_78);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_p != &local_68) {
          operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
        }
        bVar2 = CoreML::Result::good((Result *)local_a8);
        if (bVar2) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                     ,0x6d);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x250);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"!((res).good())",0xf);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        }
        else {
          if (this->_oneof_case_[0] == 10) {
            ((this->AllowedValues_).range_)->minvalue_ = 1;
LAB_00149ad9:
            pIVar5 = (this->AllowedValues_).range_;
          }
          else {
            CoreML::Specification::Int64Parameter::clear_AllowedValues(this);
            this->_oneof_case_[0] = 10;
            pIVar5 = (Int64Range *)operator_new(0x28);
            CoreML::Specification::Int64Range::Int64Range(pIVar5);
            (this->AllowedValues_).range_ = pIVar5;
            uVar1 = this->_oneof_case_[0];
            pIVar5->minvalue_ = 1;
            if (uVar1 == 10) goto LAB_00149ad9;
            CoreML::Specification::Int64Parameter::clear_AllowedValues(this);
            this->_oneof_case_[0] = 10;
            pIVar5 = (Int64Range *)operator_new(0x28);
            CoreML::Specification::Int64Range::Int64Range(pIVar5);
            (this->AllowedValues_).range_ = pIVar5;
          }
          pIVar5->maxvalue_ = 10;
          this->defaultvalue_ = 5;
          CoreML::validate<(MLModelType)404>((Result *)&local_80,&local_58);
          local_a8 = (undefined1  [8])local_80;
          std::__cxx11::string::operator=((string *)&local_a0,(string *)&local_78);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_p != &local_68) {
            operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
          }
          bVar2 = CoreML::Result::good((Result *)local_a8);
          iVar6 = 0;
          if (bVar2) goto LAB_00149c12;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                     ,0x6d);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,600);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"(res).good()",0xc);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar4," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        }
      }
    }
  }
  std::ostream::put((char)poVar4);
  iVar6 = 1;
  std::ostream::flush();
LAB_00149c12:
  if (local_a0._M_p != local_98 + 8) {
    operator_delete(local_a0._M_p,local_98._8_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_58);
  return iVar6;
}

Assistant:

int testNumberOfNeighborsWithInvalidRange() {

    Specification::Model m1;

    KNNValidatorTests::generateInterface(m1);

    auto *knnClassifier = m1.mutable_knearestneighborsclassifier();
    auto *numberOfNeighbors = knnClassifier->mutable_numberofneighbors();
    numberOfNeighbors->mutable_range()->set_minvalue(-1);
    numberOfNeighbors->mutable_range()->set_maxvalue(10);
    numberOfNeighbors->set_defaultvalue(5);

    knnClassifier->mutable_uniformweighting();

    auto *nnIndex = knnClassifier->mutable_nearestneighborsindex();
    nnIndex->mutable_squaredeuclideandistance();
    auto *kdTree = nnIndex->mutable_singlekdtreeindex();
    kdTree->set_leafsize(30);
    knnClassifier->set_defaultstringlabel("Default");

    // Validation should fail since range bounds should be > 0
    Result res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    numberOfNeighbors->mutable_range()->set_minvalue(0);
    numberOfNeighbors->mutable_range()->set_maxvalue(10);
    numberOfNeighbors->set_defaultvalue(5);

    // Validation should fail since range bounds should be > 0
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    numberOfNeighbors->mutable_range()->set_minvalue(10);
    numberOfNeighbors->mutable_range()->set_maxvalue(1);
    numberOfNeighbors->set_defaultvalue(5);

    // Validation should fail since since range max should be > range min
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    numberOfNeighbors->mutable_range()->set_minvalue(-10);
    numberOfNeighbors->mutable_range()->set_maxvalue(-5);
    numberOfNeighbors->set_defaultvalue(5);

    // Validation should fail since range values must be > 0
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    numberOfNeighbors->mutable_range()->set_minvalue(1);
    numberOfNeighbors->mutable_range()->set_maxvalue(10);
    numberOfNeighbors->set_defaultvalue(5);

    // Validation should now succeed
    res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_GOOD(res);

    return 0;

}